

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O2

void __thiscall
tchecker::details::
statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>::
compile_while(statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
              *this,typed_expression_t *cond,typed_statement_t *stmt)

{
  size_type sVar1;
  size_type sVar2;
  back_insert_iterator<std::vector<long,_std::allocator<long>_>_> *bbi;
  value_type_conflict3 local_90;
  vector<long,_std::allocator<long>_> stmt_bytecode;
  vector<long,_std::allocator<long>_> cond_bytecode;
  _Vector_base<long,_std::allocator<long>_> local_48;
  _Vector_base<long,_std::allocator<long>_> local_30;
  
  cond_bytecode.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cond_bytecode.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  cond_bytecode.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sVar1 = compile_tmp_rvalue_expression(cond,&cond_bytecode);
  stmt_bytecode.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  stmt_bytecode.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  stmt_bytecode.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sVar2 = compile_tmp_statement(stmt,&stmt_bytecode);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&local_30,&cond_bytecode);
  bbi = &this->_bytecode_back_inserter;
  append_bytecode<std::back_insert_iterator<std::vector<long,std::allocator<long>>>>
            (bbi,(vector<long,_std::allocator<long>_> *)&local_30);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_30);
  local_90 = 4;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=(bbi,&local_90);
  local_90 = sVar2 + 2;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=(bbi,&local_90);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&local_48,&stmt_bytecode);
  append_bytecode<std::back_insert_iterator<std::vector<long,std::allocator<long>>>>
            (bbi,(vector<long,_std::allocator<long>_> *)&local_48);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_48);
  local_90 = 3;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=(bbi,&local_90);
  local_90 = -4 - (sVar1 + sVar2);
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=(bbi,&local_90);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&stmt_bytecode.super__Vector_base<long,_std::allocator<long>_>);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&cond_bytecode.super__Vector_base<long,_std::allocator<long>_>);
  return;
}

Assistant:

void compile_while(tchecker::typed_expression_t const & cond, tchecker::typed_statement_t const & stmt)
  {
    // pre-compute cond and stmt bytecodes to get their respective lengths

    std::vector<tchecker::bytecode_t> cond_bytecode;
    auto cond_len = compile_tmp_rvalue_expression(cond, cond_bytecode);

    std::vector<tchecker::bytecode_t> stmt_bytecode;
    auto stmt_len = compile_tmp_statement(stmt, stmt_bytecode);

    // generation of while bytecode
    //  - insert 'cond' bytecode
    append_bytecode(_bytecode_back_inserter, cond_bytecode);

    //  - insert a conditional jump over 'stmt' bytecode and loop instruction
    _bytecode_back_inserter = tchecker::VM_JMPZ;
    _bytecode_back_inserter = stmt_len + 2;

    //  - insert bytecode for the 'stmt' statement
    append_bytecode(_bytecode_back_inserter, stmt_bytecode);

    //  - insert a loop back to 'cond' bytecode
    _bytecode_back_inserter = tchecker::VM_JMP;
    _bytecode_back_inserter = -(cond_len + 2 + stmt_len + 2);
  }